

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::queueError<Identifier,Identifier>
               (ErrorType type,char *text,Identifier *args,Identifier *args_1)

{
  ErrorType type_00;
  size_t extraout_RDX;
  Identifier *in_R8;
  string_view text_00;
  undefined1 local_48 [8];
  string message;
  Identifier *args_local_1;
  Identifier *args_local;
  char *text_local;
  ErrorType type_local;
  
  message.field_2._8_8_ = args_1;
  tinyformat::format<Identifier,Identifier>
            ((string *)local_48,(tinyformat *)text,(char *)args,args_1,in_R8);
  type_00 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
  text_00._M_str = (char *)args_1;
  text_00._M_len = extraout_RDX;
  queueError((Logger *)(ulong)type,type_00,text_00);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

static void queueError(ErrorType type, const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		queueError(type,message);
	}